

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int calc_active_worst_quality_no_stats_cbr(AV1_COMP *cpi)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long *in_RDI;
  int max_adjustment_down;
  PRIMARY_RATE_CONTROL *lp_rc;
  LAYER_CONTEXT *lc;
  int layer;
  int avg_qindex_key;
  int ambient_qp;
  int active_worst_quality;
  int adjustment;
  int64_t buff_lvl_step;
  int64_t critical_level;
  uint num_frames_weight_key;
  SVC *svc;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  AV1_COMMON *cm;
  int local_98;
  int local_94;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_4;
  
  lVar2 = *in_RDI;
  iVar1 = *(int *)((long)in_RDI + 0x9d33c);
  lVar5 = *(long *)(lVar2 + 0xac78) >> 3;
  local_4c = 0;
  iVar4 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x77f0));
  if (iVar4 == 0) {
    local_58 = *(int *)(lVar2 + 0xacbc);
    if (1 < *(int *)((long)in_RDI + 0x9d33c)) {
      lVar3 = in_RDI[0x13a91];
      if (*(int *)(lVar3 + 0x22cc) < *(int *)(lVar3 + 0x2308)) {
        local_78 = *(int *)(lVar3 + 0x22cc);
      }
      else {
        local_78 = *(int *)(lVar3 + 0x2308);
      }
      local_58 = local_78;
    }
    if ((*(int *)((long)in_RDI + 0x9d334) < 1) ||
       (SBORROW4((int)in_RDI[0xc0f4],*(int *)((long)in_RDI + 0x9d33c) * 2) ==
        (int)in_RDI[0xc0f4] + *(int *)((long)in_RDI + 0x9d33c) * -2 < 0)) {
      if (*(uint *)(in_RDI + 0x77f2) < (uint)(iVar1 * 5)) {
        if (*(int *)(lVar2 + 0xacc0) < local_58) {
          local_7c = *(int *)(lVar2 + 0xacc0);
        }
        else {
          local_7c = local_58;
        }
        local_80 = local_7c;
      }
      else {
        local_80 = *(int *)(lVar2 + 0xacc0);
      }
      local_54 = local_80;
    }
    else {
      local_54 = local_58;
    }
    if (*(int *)((long)in_RDI + 0x6082c) < local_54) {
      local_84 = *(int *)((long)in_RDI + 0x6082c);
    }
    else {
      local_84 = local_54;
    }
    if (*(long *)(lVar2 + 0xac78) < *(long *)(lVar2 + 0xad38)) {
      if ((((char)in_RDI[0x8480] == '\x03') && (*(int *)(*in_RDI + 0xc750) == 0)) &&
         (*(int *)((long)in_RDI + 0x4269c) == 1)) {
        if (*(int *)((long)in_RDI + 0x6082c) < local_84) {
          local_88 = *(int *)((long)in_RDI + 0x6082c);
        }
        else {
          local_88 = local_84;
        }
        local_50 = local_88;
        if (local_88 / 0x10 < 5) {
          local_8c = local_88 / 0x10;
        }
        else {
          local_8c = 4;
        }
        local_74 = local_8c;
      }
      else {
        if (*(int *)((long)in_RDI + 0x6082c) < (local_84 * 5) / 4) {
          local_94 = *(int *)((long)in_RDI + 0x6082c);
        }
        else {
          local_94 = (local_84 * 5) / 4;
        }
        local_50 = local_94;
        local_74 = local_94 / 3;
      }
      if (local_74 != 0) {
        lVar5 = (*(long *)(lVar2 + 0xac80) - *(long *)(lVar2 + 0xac78)) / (long)local_74;
        if (lVar5 != 0) {
          local_4c = (int)((*(long *)(lVar2 + 0xad38) - *(long *)(lVar2 + 0xac78)) / lVar5);
        }
        local_50 = local_50 - local_4c;
      }
    }
    else if (lVar5 < *(long *)(lVar2 + 0xad38)) {
      if (*(int *)((long)in_RDI + 0x6082c) < local_84) {
        local_98 = *(int *)((long)in_RDI + 0x6082c);
      }
      else {
        local_98 = local_84;
      }
      local_50 = local_98;
      if (lVar5 != 0) {
        lVar5 = *(long *)(lVar2 + 0xac78) - lVar5;
        if (lVar5 != 0) {
          local_4c = (int)(((long)(*(int *)((long)in_RDI + 0x6082c) - local_84) *
                           (*(long *)(lVar2 + 0xac78) - *(long *)(lVar2 + 0xad38))) / lVar5);
        }
        local_50 = local_4c + local_98;
      }
    }
    else {
      local_50 = *(int *)((long)in_RDI + 0x6082c);
    }
    local_4 = local_50;
  }
  else {
    local_4 = *(int *)((long)in_RDI + 0x6082c);
  }
  return local_4;
}

Assistant:

static int calc_active_worst_quality_no_stats_cbr(const AV1_COMP *cpi) {
  // Adjust active_worst_quality: If buffer is above the optimal/target level,
  // bring active_worst_quality down depending on fullness of buffer.
  // If buffer is below the optimal level, let the active_worst_quality go from
  // ambient Q (at buffer = optimal level) to worst_quality level
  // (at buffer = critical level).
  const AV1_COMMON *const cm = &cpi->common;
  const RATE_CONTROL *rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *p_rc = &cpi->ppi->p_rc;
  const SVC *const svc = &cpi->svc;
  unsigned int num_frames_weight_key = 5 * cpi->svc.number_temporal_layers;
  // Buffer level below which we push active_worst to worst_quality.
  int64_t critical_level = p_rc->optimal_buffer_level >> 3;
  int64_t buff_lvl_step = 0;
  int adjustment = 0;
  int active_worst_quality;
  int ambient_qp;
  if (frame_is_intra_only(cm)) return rc->worst_quality;
  // For ambient_qp we use minimum of avg_frame_qindex[KEY_FRAME/INTER_FRAME]
  // for the first few frames following key frame. These are both initialized
  // to worst_quality and updated with (3/4, 1/4) average in postencode_update.
  // So for first few frames following key, the qp of that key frame is weighted
  // into the active_worst_quality setting. For SVC the key frame should
  // correspond to layer (0, 0), so use that for layer context.
  int avg_qindex_key = p_rc->avg_frame_qindex[KEY_FRAME];
  if (svc->number_temporal_layers > 1) {
    int layer = LAYER_IDS_TO_IDX(0, 0, svc->number_temporal_layers);
    const LAYER_CONTEXT *lc = &svc->layer_context[layer];
    const PRIMARY_RATE_CONTROL *const lp_rc = &lc->p_rc;
    avg_qindex_key =
        AOMMIN(lp_rc->avg_frame_qindex[KEY_FRAME], lp_rc->last_q[KEY_FRAME]);
  }
  if (svc->temporal_layer_id > 0 &&
      rc->frames_since_key < 2 * svc->number_temporal_layers) {
    ambient_qp = avg_qindex_key;
  } else {
    ambient_qp =
        (cm->current_frame.frame_number < num_frames_weight_key)
            ? AOMMIN(p_rc->avg_frame_qindex[INTER_FRAME], avg_qindex_key)
            : p_rc->avg_frame_qindex[INTER_FRAME];
  }
  ambient_qp = AOMMIN(rc->worst_quality, ambient_qp);

  if (p_rc->buffer_level > p_rc->optimal_buffer_level) {
    // Adjust down.
    int max_adjustment_down;  // Maximum adjustment down for Q

    if (cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ && !cpi->ppi->use_svc &&
        (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN)) {
      active_worst_quality = AOMMIN(rc->worst_quality, ambient_qp);
      max_adjustment_down = AOMMIN(4, active_worst_quality / 16);
    } else {
      active_worst_quality = AOMMIN(rc->worst_quality, ambient_qp * 5 / 4);
      max_adjustment_down = active_worst_quality / 3;
    }

    if (max_adjustment_down) {
      buff_lvl_step =
          ((p_rc->maximum_buffer_size - p_rc->optimal_buffer_level) /
           max_adjustment_down);
      if (buff_lvl_step)
        adjustment = (int)((p_rc->buffer_level - p_rc->optimal_buffer_level) /
                           buff_lvl_step);
      active_worst_quality -= adjustment;
    }
  } else if (p_rc->buffer_level > critical_level) {
    // Adjust up from ambient Q.
    active_worst_quality = AOMMIN(rc->worst_quality, ambient_qp);
    if (critical_level) {
      buff_lvl_step = (p_rc->optimal_buffer_level - critical_level);
      if (buff_lvl_step) {
        adjustment = (int)((rc->worst_quality - ambient_qp) *
                           (p_rc->optimal_buffer_level - p_rc->buffer_level) /
                           buff_lvl_step);
      }
      active_worst_quality += adjustment;
    }
  } else {
    // Set to worst_quality if buffer is below critical level.
    active_worst_quality = rc->worst_quality;
  }
  return active_worst_quality;
}